

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  long *plVar2;
  CommentInfo *pCVar3;
  size_type *psVar4;
  string local_60;
  string local_40;
  
  if ((this->cs_ != None) && (pCVar3 = root->comments_, pCVar3 != (CommentInfo *)0x0)) {
    if (pCVar3[1].comment_ != (char *)0x0) {
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x11f424);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_60.field_2._M_allocated_capacity = *psVar4;
        local_60.field_2._8_8_ = plVar2[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar4;
        local_60._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_60._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      pCVar3 = root->comments_;
      if (pCVar3 == (CommentInfo *)0x0) {
        return;
      }
    }
    if (pCVar3[2].comment_ != (char *)0x0) {
      writeIndent(this);
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_60,root,commentAfter);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}